

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  lws_vhost *vhost_00;
  lws_plat_file_ops *plVar3;
  undefined1 local_fc0 [8];
  timeval tv;
  int n;
  int opts;
  int pp_secs;
  int use_ssl;
  int gid;
  int uid;
  char ca_path [1024];
  char key_path [1024];
  char cert_path [1024];
  char **local_390;
  char *iface;
  char interface_name [128];
  lws_vhost *vhost;
  lws_context_creation_info info;
  char **argv_local;
  int argc_local;
  
  info._unused[3] = argv;
  memset(&iface,0,0x80);
  local_390 = (char **)0x0;
  memset(key_path + 0x3f8,0,0x400);
  memset(ca_path + 0x3f8,0,0x400);
  memset(&gid,0,0x400);
  use_ssl = -1;
  pp_secs = -1;
  bVar1 = false;
  n = 0;
  tv.tv_usec._4_4_ = 0;
  tv.tv_usec._0_4_ = 0;
  memset(&vhost,0,0x2e0);
  vhost._0_4_ = 0x1e01;
  while (-1 < (int)tv.tv_usec) {
    tv.tv_usec._0_4_ = getopt_long(argc,info._unused[3],"eci:hsap:d:DC:K:A:R:vu:g:P:kU:n",options,0)
    ;
    if (-1 < (int)tv.tv_usec) {
      if ((int)tv.tv_usec - 0x41U < 0x35 || (int)tv.tv_usec == 0x76) {
        switch((long)&switchD_0010c726::switchdataD_00158074 +
               (long)(int)(&switchD_0010c726::switchdataD_00158074)[(int)tv.tv_usec - 0x41U]) {
        case 0x10c728:
          tv.tv_usec._4_4_ = tv.tv_usec._4_4_ | 0x10;
          break;
        case 0x10c73e:
          use_ssl = atoi(_optarg);
          break;
        case 0x10c758:
          pp_secs = atoi(_optarg);
          break;
        case 0x10c772:
          debug_level = atoi(_optarg);
          break;
        case 0x10c78c:
          test_options = test_options | 1;
          break;
        case 0x10c7a0:
          bVar1 = true;
          tv.tv_usec._4_4_ = tv.tv_usec._4_4_ | 0x1000;
          break;
        case 0x10c7c2:
          tv.tv_usec._4_4_ = tv.tv_usec._4_4_ | 0x1008;
          break;
        case 0x10c7da:
          vhost._0_4_ = atoi(_optarg);
          break;
        case 0x10c7f4:
          lws_strncpy((char *)&iface,_optarg,0x80);
          local_390 = &iface;
          break;
        case 0x10c822:
          lws_strncpy((char *)&iface,_optarg,0x80);
          local_390 = &iface;
          tv.tv_usec._4_4_ = tv.tv_usec._4_4_ | 0x4000;
          break;
        case 0x10c863:
          info.socks_proxy_address._4_4_ = 1;
          break;
        case 0x10c872:
          close_testing = 1;
          fprintf(_stderr,
                  " Close testing mode -- closes on client after 50 dumb incrementsand suppresses lws_mirror spam\n"
                 );
          break;
        case 0x10c899:
          lws_strncpy(key_path + 0x3f8,_optarg,0x400);
          break;
        case 0x10c8b9:
          lws_strncpy(ca_path + 0x3f8,_optarg,0x400);
          break;
        case 0x10c8d9:
          lws_strncpy((char *)&gid,_optarg,0x400);
          break;
        case 0x10c8f9:
          n = atoi(_optarg);
          _lws_log(4,"Setting pingpong interval to %d\n",(ulong)(uint)n);
          break;
        case 0x10c929:
          bVar1 = true;
          tv.tv_usec._4_4_ = tv.tv_usec._4_4_ | 0x1002;
          break;
        case 0x10c948:
          lws_strncpy(crl_path,_optarg,0x400);
          break;
        case 0x10c965:
          fprintf(_stderr,"Usage: test-server [--port=<p>] [--ssl] [-d <log bitfield>]\n");
          exit(1);
        }
      }
    }
  }
  signal(2,sighandler);
  signal(10,sighandler);
  lws_set_log_level(debug_level,(_func_void_int_char_ptr *)0x0);
  _lws_log(4,"libwebsockets test server - license MIT\n");
  _lws_log(4,"(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");
  printf("Using resource path \"%s\"\n",resource_path);
  info._0_8_ = local_390;
  info.iface = (char *)protocols;
  info.ssl_private_key_password = (char *)0x0;
  info.ssl_cert_filepath = (char *)0x0;
  info.ssl_options_clear._0_2_ = (undefined2)n;
  if (bVar1) {
    sVar2 = strlen(resource_path);
    if (0x3e0 < sVar2) {
      _lws_log(1,"resource path too long\n");
      return -1;
    }
    if (key_path[0x3f8] == '\0') {
      sprintf(key_path + 0x3f8,"%s/libwebsockets-test-server.pem",resource_path);
    }
    sVar2 = strlen(resource_path);
    if (0x3e0 < sVar2) {
      _lws_log(1,"resource path too long\n");
      return -1;
    }
    if (ca_path[0x3f8] == '\0') {
      sprintf(ca_path + 0x3f8,"%s/libwebsockets-test-server.key.pem",resource_path);
    }
    info.ssl_private_key_password = key_path + 0x3f8;
    info.ssl_cert_filepath = ca_path + 0x3f8;
    if ((char)gid != '\0') {
      info.ssl_private_key_filepath = (char *)&gid;
    }
  }
  info.http_proxy_address._4_4_ = pp_secs;
  info.http_proxy_port = use_ssl;
  info._96_8_ = (long)(int)tv.tv_usec._4_4_ | 0x2100;
  info.protocols = (lws_protocols *)exts;
  info.count_threads = 5;
  info.ssl_ca_filepath =
       "ECDHE-ECDSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-SHA384:HIGH:!aNULL:!eNULL:!EXPORT:!DES:!MD5:!PSK:!RC4:!HMAC_SHA1:!SHA1:!DHE-RSA-AES128-GCM-SHA256:!DHE-RSA-AES128-SHA256:!AES128-GCM-SHA256:!AES128-SHA256:!DHE-RSA-AES256-SHA256:!AES256-GCM-SHA384:!AES256-SHA256"
  ;
  info.log_filepath = (char *)&mount;
  info.ssl_info_event_mask._0_2_ = 0x18;
  info.ssl_info_event_mask._2_2_ = 400;
  if (bVar1) {
    info._96_8_ = (long)(int)tv.tv_usec._4_4_ | 0x3900;
  }
  context = lws_create_context((lws_context_creation_info *)&vhost);
  if (context == (lws_context *)0x0) {
    _lws_log(1,"libwebsocket init failed\n");
    argv_local._4_4_ = -1;
  }
  else {
    info.plugin_dirs = (char **)&pvo;
    vhost_00 = lws_create_vhost(context,(lws_context_creation_info *)&vhost);
    if (vhost_00 == (lws_vhost *)0x0) {
      _lws_log(1,"vhost creation failed\n");
      argv_local._4_4_ = -1;
    }
    else {
      vhost._0_4_ = (int)vhost + 1;
      lws_init_vhost_client_ssl((lws_context_creation_info *)&vhost,vhost_00);
      plVar3 = lws_get_fops(context);
      memcpy(&fops_plat,plVar3,0x60);
      plVar3 = lws_get_fops(context);
      plVar3->open = test_server_fops_open;
      tv.tv_usec._0_4_ = 0;
      while (-1 < (int)tv.tv_usec && force_exit == 0) {
        gettimeofday((timeval *)local_fc0,(__timezone_ptr_t)0x0);
        tv.tv_usec._0_4_ = lws_service(context,0);
        if ((dynamic_vhost_enable == 0) || (dynamic_vhost != (lws_vhost *)0x0)) {
          if ((dynamic_vhost_enable == 0) && (dynamic_vhost != (lws_vhost *)0x0)) {
            _lws_log(4,"destroying dynamic vhost...\n");
            lws_vhost_destroy(dynamic_vhost);
            dynamic_vhost = (lws_vhost *)0x0;
          }
        }
        else {
          _lws_log(4,"creating dynamic vhost...\n");
          dynamic_vhost = lws_create_vhost(context,(lws_context_creation_info *)&vhost);
        }
      }
      lws_context_destroy(context);
      _lws_log(4,"libwebsockets-test-server exited cleanly\n");
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	struct lws_context_creation_info info;
	struct lws_vhost *vhost;
	char interface_name[128] = "";
	const char *iface = NULL;
	char cert_path[1024] = "";
	char key_path[1024] = "";
	char ca_path[1024] = "";
	int uid = -1, gid = -1;
	int use_ssl = 0;
	int pp_secs = 0;
	int opts = 0;
	int n = 0;
#ifndef LWS_NO_DAEMONIZE
	int daemonize = 0;
#endif

	/*
	 * take care to zero down the info struct, he contains random garbaage
	 * from the stack otherwise
	 */
	memset(&info, 0, sizeof info);
	info.port = 7681;

	while (n >= 0) {
#if defined(LWS_HAS_GETOPT_LONG) || defined(WIN32)
		n = getopt_long(argc, argv, "eci:hsap:d:DC:K:A:R:vu:g:P:kU:n", options, NULL);
#else
		n = getopt(argc, argv, "eci:hsap:d:DC:K:A:R:vu:g:P:kU:n");
#endif
		if (n < 0)
			continue;
		switch (n) {
		case 'e':
			opts |= LWS_SERVER_OPTION_LIBEV;
			break;
#ifndef LWS_NO_DAEMONIZE
		case 'D':
			daemonize = 1;
			break;
#endif
		case 'u':
			uid = atoi(optarg);
			break;
		case 'g':
			gid = atoi(optarg);
			break;
		case 'd':
			debug_level = atoi(optarg);
			break;
		case 'n':
			/* no dumb increment send */
			test_options |= 1;
			break;
		case 's':
			use_ssl = 1;
			opts |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
			break;
		case 'a':
			opts |= LWS_SERVER_OPTION_ALLOW_NON_SSL_ON_SSL_PORT;
			break;
		case 'p':
			info.port = atoi(optarg);
			break;
		case 'i':
			lws_strncpy(interface_name, optarg, sizeof interface_name);
			iface = interface_name;
			break;
		case 'U':
			lws_strncpy(interface_name, optarg, sizeof interface_name);
			iface = interface_name;
			opts |= LWS_SERVER_OPTION_UNIX_SOCK;
			break;
		case 'k':
			info.bind_iface = 1;
#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
			info.caps[0] = CAP_NET_RAW;
			info.count_caps = 1;
#endif
			break;
		case 'c':
			close_testing = 1;
			fprintf(stderr, " Close testing mode -- closes on "
					   "client after 50 dumb increments"
					   "and suppresses lws_mirror spam\n");
			break;
		case 'C':
			lws_strncpy(cert_path, optarg, sizeof(cert_path));
			break;
		case 'K':
			lws_strncpy(key_path, optarg, sizeof(key_path));
			break;
		case 'A':
			lws_strncpy(ca_path, optarg, sizeof(ca_path));
			break;
		case 'P':
			pp_secs = atoi(optarg);
			lwsl_notice("Setting pingpong interval to %d\n", pp_secs);
			break;
#if defined(LWS_WITH_TLS)
		case 'v':
			use_ssl = 1;
			opts |= LWS_SERVER_OPTION_REQUIRE_VALID_OPENSSL_CLIENT_CERT;
			break;

#if defined(LWS_HAVE_SSL_CTX_set1_param)
		case 'R':
			lws_strncpy(crl_path, optarg, sizeof(crl_path));
			break;
#endif
#endif
		case 'h':
			fprintf(stderr, "Usage: test-server "
					"[--port=<p>] [--ssl] "
					"[-d <log bitfield>]\n");
			exit(1);
		}
	}

#if !defined(LWS_NO_DAEMONIZE) && !defined(WIN32)
	/*
	 * normally lock path would be /var/lock/lwsts or similar, to
	 * simplify getting started without having to take care about
	 * permissions or running as root, set to /tmp/.lwsts-lock
	 */
	if (daemonize && lws_daemonize("/tmp/.lwsts-lock")) {
		fprintf(stderr, "Failed to daemonize\n");
		return 10;
	}
#endif

	signal(SIGINT, sighandler);
#if !defined(WIN32) && !defined(_WIN32)
	/* because windows is too dumb to have SIGUSR1... */
	/* dynamic vhost create / destroy toggle (on port + 1) */
	signal(SIGUSR1, sighandler);
#endif

	/* tell the library what debug level to emit and to send it to stderr */
	lws_set_log_level(debug_level, NULL);

	lwsl_notice("libwebsockets test server - license MIT\n");
	lwsl_notice("(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");

	printf("Using resource path \"%s\"\n", resource_path);
#if defined(LWS_WITH_EXTERNAL_POLL)
#if !defined(WIN32) && !defined(_WIN32) && !defined(__ANDROID__)
	max_poll_elements = getdtablesize();
#else
	max_poll_elements = sysconf(_SC_OPEN_MAX);
#endif
	pollfds = malloc(max_poll_elements * sizeof (struct lws_pollfd));
	fd_lookup = malloc(max_poll_elements * sizeof (int));
	if (pollfds == NULL || fd_lookup == NULL) {
		lwsl_err("Out of memory pollfds=%d\n", max_poll_elements);
		return -1;
	}
#endif

	info.iface = iface;
	info.protocols = protocols;
	info.ssl_cert_filepath = NULL;
	info.ssl_private_key_filepath = NULL;
	info.ws_ping_pong_interval = pp_secs;

	if (use_ssl) {
		if (strlen(resource_path) > sizeof(cert_path) - 32) {
			lwsl_err("resource path too long\n");
			return -1;
		}
		if (!cert_path[0])
			sprintf(cert_path, "%s/libwebsockets-test-server.pem",
								resource_path);
		if (strlen(resource_path) > sizeof(key_path) - 32) {
			lwsl_err("resource path too long\n");
			return -1;
		}
		if (!key_path[0])
			sprintf(key_path, "%s/libwebsockets-test-server.key.pem",
								resource_path);

		info.ssl_cert_filepath = cert_path;
		info.ssl_private_key_filepath = key_path;
		if (ca_path[0])
			info.ssl_ca_filepath = ca_path;
	}
	info.gid = gid;
	info.uid = uid;
	info.options = opts | LWS_SERVER_OPTION_VALIDATE_UTF8 | LWS_SERVER_OPTION_EXPLICIT_VHOSTS;
	info.extensions = exts;
	info.timeout_secs = 5;
	info.ssl_cipher_list = "ECDHE-ECDSA-AES256-GCM-SHA384:"
			       "ECDHE-RSA-AES256-GCM-SHA384:"
			       "DHE-RSA-AES256-GCM-SHA384:"
			       "ECDHE-RSA-AES256-SHA384:"
			       "HIGH:!aNULL:!eNULL:!EXPORT:"
			       "!DES:!MD5:!PSK:!RC4:!HMAC_SHA1:"
			       "!SHA1:!DHE-RSA-AES128-GCM-SHA256:"
			       "!DHE-RSA-AES128-SHA256:"
			       "!AES128-GCM-SHA256:"
			       "!AES128-SHA256:"
			       "!DHE-RSA-AES256-SHA256:"
			       "!AES256-GCM-SHA384:"
			       "!AES256-SHA256";
	info.mounts = &mount;
	info.ip_limit_ah = 24; /* for testing */
	info.ip_limit_wsi = 400; /* for testing */

	if (use_ssl)
		/* redirect guys coming on http */
		info.options |= LWS_SERVER_OPTION_REDIRECT_HTTP_TO_HTTPS;

	context = lws_create_context(&info);
	if (context == NULL) {
		lwsl_err("libwebsocket init failed\n");
		return -1;
	}

	info.pvo = &pvo;

	vhost = lws_create_vhost(context, &info);
	if (!vhost) {
		lwsl_err("vhost creation failed\n");
		return -1;
	}

	/*
	 * For testing dynamic vhost create / destroy later, we use port + 1
	 * Normally if you were creating more vhosts, you would set info.name
	 * for each to be the hostname external clients use to reach it
	 */

	info.port++;

#if defined(LWS_WITH_CLIENT) && defined(LWS_WITH_TLS)
	lws_init_vhost_client_ssl(&info, vhost);
#endif

	/* this shows how to override the lws file operations.	You don't need
	 * to do any of this unless you have a reason (eg, want to serve
	 * compressed files without decompressing the whole archive)
	 */
	/* stash original platform fops */
	fops_plat = *(lws_get_fops(context));
	/* override the active fops */
	lws_get_fops(context)->open = test_server_fops_open;

	n = 0;
	while (n >= 0 && !force_exit) {
		struct timeval tv;

		gettimeofday(&tv, NULL);

		/*
		 * This provokes the LWS_CALLBACK_SERVER_WRITEABLE for every
		 * live websocket connection using the DUMB_INCREMENT protocol,
		 * as soon as it can take more packets (usually immediately)
		 */

#if defined(LWS_WITH_EXTERNAL_POLL)
		/*
		 * this represents an existing server's single poll action
		 * which also includes libwebsocket sockets
		 */
		n = poll(pollfds, count_pollfds, 50);
		if (n < 0)
			continue;

		if (n) {
			for (n = 0; n < count_pollfds; n++)
				if (pollfds[n].revents)
					/*
					* returns immediately if the fd does not
					* match anything under libwebsockets
					* control
					*/
					if (lws_service_fd(context,
								  &pollfds[n]) < 0)
						goto done;

			/* if needed, force-service wsis that may not have read all input */
			while (!lws_service_adjust_timeout(context, 1, 0)) {
				lwsl_notice("extpoll doing forced service!\n");
				lws_service_tsi(context, -1, 0);
			}
		}
#else
		/*
		 * If libwebsockets sockets are all we care about,
		 * you can use this api which takes care of the poll()
		 * and looping through finding who needed service.
		 */

		n = lws_service(context, 0);
#endif

		if (dynamic_vhost_enable && !dynamic_vhost) {
			lwsl_notice("creating dynamic vhost...\n");
			dynamic_vhost = lws_create_vhost(context, &info);
		} else
			if (!dynamic_vhost_enable && dynamic_vhost) {
				lwsl_notice("destroying dynamic vhost...\n");
				lws_vhost_destroy(dynamic_vhost);
				dynamic_vhost = NULL;
			}

	}

#if defined(LWS_WITH_EXTERNAL_POLL)
done:
#endif

	lws_context_destroy(context);

	lwsl_notice("libwebsockets-test-server exited cleanly\n");

	return 0;
}